

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::InnerProductParameter::InternalSerializeWithCachedSizesToArray
          (InnerProductParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  FillerParameter *pFVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    uVar6 = this->num_output_;
    *target = '\b';
    pbVar9 = target + 1;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar9 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar7;
    target = pbVar9 + 1;
  }
  if ((uVar1 & 0x10) != 0) {
    bVar4 = this->bias_term_;
    *target = 0x10;
    target[1] = bVar4;
    target = target + 2;
  }
  if ((uVar1 & 1) != 0) {
    pFVar2 = this->weight_filler_;
    *target = 0x1a;
    pbVar9 = target + 1;
    uVar6 = pFVar2->_cached_size_;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar9 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar7;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar2,false,pbVar9 + 1);
  }
  if ((uVar1 & 2) != 0) {
    pFVar2 = this->bias_filler_;
    *target = 0x22;
    pbVar9 = target + 1;
    uVar6 = pFVar2->_cached_size_;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar9 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar7;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar2,false,pbVar9 + 1);
  }
  if ((uVar1 & 0x20) != 0) {
    uVar8 = (ulong)this->axis_;
    pbVar9 = target + 1;
    *target = 0x28;
    uVar10 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar9 = (byte)uVar8 | 0x80;
        uVar10 = uVar8 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar10;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar10;
    target = pbVar9 + 1;
  }
  if ((uVar1 & 8) != 0) {
    bVar4 = this->transpose_;
    *target = 0x30;
    target[1] = bVar4;
    target = target + 2;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* InnerProductParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.InnerProductParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->bias_term(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 3;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 4;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, *this->bias_filler_, deterministic, target);
  }

  // optional int32 axis = 5 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5, this->axis(), target);
  }

  // optional bool transpose = 6 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->transpose(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.InnerProductParameter)
  return target;
}